

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

const_iterator __thiscall
QHash<QPersistentModelIndex,_QEditorInfo>::constFindImpl<QPersistentModelIndex>
          (QHash<QPersistentModelIndex,_QEditorInfo> *this,QPersistentModelIndex *key)

{
  Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *this_00;
  Data *pDVar1;
  ulong uVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = this->d;
  if ((this_00 != (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0) &&
     (this_00->size != 0)) {
    uVar2 = ((ulong)key->d >> 0x20 ^ (ulong)key->d) * -0x2917014799a6026d;
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::
            findBucketWithHash<QPersistentModelIndex>
                      (this_00,key,uVar2 >> 0x20 ^ this_00->seed ^ uVar2);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar1 = this->d;
      uVar2 = ((ulong)((long)BVar3.span - (long)pDVar1->spans) >> 4) * 0x1c71c71c71c71c80 |
              BVar3.index;
      goto LAB_0054da85;
    }
  }
  uVar2 = 0;
  pDVar1 = (Data *)0x0;
LAB_0054da85:
  cVar4.i.bucket = uVar2;
  cVar4.i.d = pDVar1;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }